

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall (anonymous_namespace)::TestCallback::fromAdmin(TestCallback *this)

{
  SessionID *in_RDX;
  Message *in_RSI;
  
  anon_unknown.dwarf_5319c9::TestCallback::fromAdmin((TestCallback *)(this + -8),in_RSI,in_RDX);
  return;
}

Assistant:

EXCEPT(FieldNotFound, IncorrectDataFormat, IncorrectTagValue, RejectLogon) {
    MsgType msgType;
    message.getHeader().getField(msgType);
    switch (msgType.getValue()[0]) {
    case '0':
      fromHeartbeat++;
      break;
    case '1':
      fromTestRequest++;
      break;
    case '5':
      fromLogout++;
      break;
    case '3':
      fromReject++;
      break;
    case '4':
      fromSequenceReset++;
      break;
    }
  }